

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

void Eigen::internal::
     generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Matrix<double,1,_1,1,1,_1>>
               (Matrix<double,_1,__1,_1,_1,__1> *dst,
               Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *lhs,
               Matrix<double,__1,__1,_0,__1,__1> *rhs,Scalar *alpha)

{
  double dVar1;
  double *pdVar2;
  ReturnType RVar3;
  LhsNested actual_lhs;
  BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true,_true>
  local_90;
  MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_58 [56];
  
  if ((rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols == 1)
  {
    dVar1 = *alpha;
    BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_1,_-1,_true,_true>
    ::BlockImpl_dense(&local_90,lhs,0);
    Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_58,rhs,0)
    ;
    RVar3 = MatrixBase<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>const,1,-1,true>>
            ::dot<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>>
                      ((MatrixBase<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>const,1,_1,true>>
                        *)&local_90,local_58);
    pdVar2 = (dst->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.m_data;
    *pdVar2 = RVar3 * dVar1 + *pdVar2;
  }
  else {
    local_90.
    super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1,__1,_true>,_0>
    .m_data = (PointerType)lhs->m_matrix;
    gemv_dense_selector<1,0,true>::
    run<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,1,_1,1,1,_1>>
              ((Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_90,rhs,dst,alpha);
  }
  return;
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void scaleAndAddTo(Dest& dst, const Lhs& lhs, const Rhs& rhs, const Scalar& alpha)
  {
    // Fallback to inner product if both the lhs and rhs is a runtime vector.
    if (lhs.rows() == 1 && rhs.cols() == 1) {
      dst.coeffRef(0,0) += alpha * lhs.row(0).conjugate().dot(rhs.col(0));
      return;
    }
    LhsNested actual_lhs(lhs);
    RhsNested actual_rhs(rhs);
    internal::gemv_dense_selector<Side,
                            (int(MatrixType::Flags)&RowMajorBit) ? RowMajor : ColMajor,
                            bool(internal::blas_traits<MatrixType>::HasUsableDirectAccess)
                           >::run(actual_lhs, actual_rhs, dst, alpha);
  }